

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O3

void __thiscall Diligent::FixedBlockMemoryAllocator::Free(FixedBlockMemoryAllocator *this,void *Ptr)

{
  char (*pacVar1) [27];
  int iVar2;
  iterator __it;
  pointer pvVar3;
  char (*Args_1) [27];
  __hashtable *__h;
  string msg;
  unsigned_long PageId;
  string local_58;
  void *local_38;
  char (*local_30) [27];
  
  local_38 = Ptr;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar2 == 0) {
    __it = std::
           _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->m_AddrToPageId)._M_h,&local_38);
    if (__it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur ==
        (__node_type *)0x0) {
      FormatString<char[67]>
                (&local_58,
                 (char (*) [67])"Address not found in the allocations list - double freeing memory?"
                );
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0x102);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pacVar1 = *(char (**) [27])
                 ((long)__it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>
                        ._M_cur + 0x10);
      pvVar3 = (this->m_PagePool).
               super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Args_1 = (char (*) [27])
               ((long)(this->m_PagePool).
                      super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 5);
      local_30 = pacVar1;
      if (Args_1 <= pacVar1) {
        FormatString<char[26],char[27]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"PageId < m_PagePool.size()",Args_1);
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"Free",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                   ,0xf3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pvVar3 = (this->m_PagePool).
                 super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      MemoryPage::DeAllocate(pvVar3 + (long)pacVar1,local_38);
      local_58._M_dataplus._M_p = (pointer)&this->m_AvailablePages;
      std::
      _Hashtable<unsigned_long,unsigned_long,Diligent::STDAllocator<unsigned_long,Diligent::IMemoryAllocator>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<Diligent::STDAllocator<std::__detail::_Hash_node<unsigned_long,false>,Diligent::IMemoryAllocator>>>
                ((_Hashtable<unsigned_long,unsigned_long,Diligent::STDAllocator<unsigned_long,Diligent::IMemoryAllocator>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_58._M_dataplus._M_p,&local_30);
      std::
      _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->m_AddrToPageId)._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void FixedBlockMemoryAllocator::Free(void* Ptr)
{
    std::lock_guard<std::mutex> LockGuard(m_Mutex);
    auto                        PageIdIt = m_AddrToPageId.find(Ptr);
    if (PageIdIt != m_AddrToPageId.end())
    {
        auto PageId = PageIdIt->second;
        VERIFY_EXPR(PageId < m_PagePool.size());
        m_PagePool[PageId].DeAllocate(Ptr);
        m_AvailablePages.insert(PageId);
        m_AddrToPageId.erase(PageIdIt);
        if (m_AvailablePages.size() > 1 && !m_PagePool[PageId].HasAllocations())
        {
            // In current implementation pages are never released!
            // Note that if we delete a page, all indices past it will be invalid

            //m_PagePool.erase(m_PagePool.begin() + PageId);
            //m_AvailablePages.erase(PageId);
        }
    }
    else
    {
        UNEXPECTED("Address not found in the allocations list - double freeing memory?");
    }
}